

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall V2Transport::MarkBytesSent(V2Transport *this,size_t bytes_sent)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  Logger *this_00;
  uint uVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock52;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock52.super_unique_lock._M_device = &(this->m_send_mutex).super_mutex;
  criticalblock52.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock52.super_unique_lock);
  if (this->m_send_state == AWAITING_KEY) {
    if ((bytes_sent != 0) && (this->m_send_pos == 0)) {
      this_00 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      if (bVar4) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "MarkBytesSent";
        logging_function._M_len = 0xd;
        LogPrintFormatInternal<long>
                  (logging_function,source_file,0x5e5,NET,Debug,(ConstevalFormatString<1U>)0xf795fd,
                   &this->m_nodeid);
      }
    }
  }
  else if (this->m_send_state == V1) {
    V1Transport::MarkBytesSent(&this->m_v1_fallback,bytes_sent);
    goto LAB_008ba7a6;
  }
  uVar5 = (int)bytes_sent + this->m_send_pos;
  this->m_send_pos = uVar5;
  puVar2 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0x17 < uVar5) {
    this->m_sent_v1_header_worth = true;
  }
  if ((long)puVar3 - (long)puVar2 == (ulong)uVar5) {
    this->m_send_pos = 0;
    puVar3 = (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_send_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    }
  }
LAB_008ba7a6:
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void V2Transport::MarkBytesSent(size_t bytes_sent) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.MarkBytesSent(bytes_sent);

    if (m_send_state == SendState::AWAITING_KEY && m_send_pos == 0 && bytes_sent > 0) {
        LogDebug(BCLog::NET, "start sending v2 handshake to peer=%d\n", m_nodeid);
    }

    m_send_pos += bytes_sent;
    Assume(m_send_pos <= m_send_buffer.size());
    if (m_send_pos >= CMessageHeader::HEADER_SIZE) {
        m_sent_v1_header_worth = true;
    }
    // Wipe the buffer when everything is sent.
    if (m_send_pos == m_send_buffer.size()) {
        m_send_pos = 0;
        ClearShrink(m_send_buffer);
    }
}